

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_parser.cpp
# Opt level: O3

void __thiscall
ArgParser::add(ArgParser *this,float *var,string *name,string *shortName,string *description,
              bool optional)

{
  pointer pcVar1;
  ArgHolder arg;
  string local_170;
  string local_150;
  string local_130;
  ArgHolder local_110;
  
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,pcVar1,pcVar1 + name->_M_string_length);
  pcVar1 = (shortName->_M_dataplus)._M_p;
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,pcVar1,pcVar1 + shortName->_M_string_length);
  pcVar1 = (description->_M_dataplus)._M_p;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,pcVar1,pcVar1 + description->_M_string_length);
  ArgHolder::ArgHolder(&local_110,&local_170,&local_130,&local_150,optional);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  local_110.argType = ARG_FLOAT;
  local_110.varFLOAT = var;
  std::vector<ArgHolder,_std::allocator<ArgHolder>_>::push_back(&this->m_args,&local_110);
  ArgHolder::~ArgHolder(&local_110);
  return;
}

Assistant:

void ArgParser::add(float *var,
                    std::string name, std::string shortName, std::string description,
                    bool optional)
{
    ArgHolder arg(name, shortName, description, optional);
    arg.varFLOAT = var;
    arg.argType = ARG_FLOAT;
    m_args.push_back(arg);
}